

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::WatWriter::FlushExprTreeVector
          (WatWriter *this,
          vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          *expr_trees)

{
  ExprType EVar1;
  pointer pEVar2;
  pointer pCVar3;
  pointer pTVar4;
  Expr *base;
  bool bVar5;
  BlockExprBase<(wabt::ExprType)8> *pBVar6;
  char *pcVar7;
  BlockExprBase<(wabt::ExprType)27> *pBVar8;
  IfExpr *pIVar9;
  TryExpr *pTVar10;
  TryTableExpr *pTVar11;
  ulong uVar12;
  Catch *catch_;
  pointer this_00;
  Var *var;
  pointer pEVar13;
  ExprVisitorDelegate delegate;
  ExprTree expr_tree;
  ExprVisitor local_98;
  
  pEVar13 = (expr_trees->
            super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (expr_trees->
           super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pEVar13 == pEVar2) {
      return;
    }
    ExprTree::ExprTree(&expr_tree,pEVar13);
    base = expr_tree.expr;
    EVar1 = (expr_tree.expr)->type_;
    if (EVar1 == TryTable) {
      pTVar11 = cast<wabt::TryTableExpr,wabt::Expr>(expr_tree.expr);
      WritePuts(this,"(",None);
      pcVar7 = Opcode::GetName((Opcode *)&Opcode::TryTable_Opcode);
      WritePutsSpace(this,pcVar7);
      if ((pTVar11->block).label._M_string_length == 0) {
        WriteTypes(this,&(pTVar11->block).decl.sig.param_types,"param");
        WriteTypes(this,&(pTVar11->block).decl.sig.result_types,"result");
        Writef(this," ;; label = @%u",
               ((long)(this->super_ModuleContext).label_stack_.
                      super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->super_ModuleContext).label_stack_.
                     super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x58 & 0xffffffff);
      }
      else {
        WriteString(this,&(pTVar11->block).label,Space);
        WriteTypes(this,&(pTVar11->block).decl.sig.param_types,"param");
        WriteTypes(this,&(pTVar11->block).decl.sig.result_types,"result");
      }
      WriteNewline(this,true);
      this->indent_ = this->indent_ + 2;
      pTVar4 = (pTVar11->catches).
               super__Vector_base<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (var = &((pTVar11->catches).
                   super__Vector_base<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>._M_impl.
                   super__Vector_impl_data._M_start)->target; (pointer)&var[-2].field_2 != pTVar4;
          var = (Var *)&var[2].field_2) {
        WritePuts(this,"(",None);
        uVar12 = (ulong)(uint)var[1].loc.filename._M_len;
        if (uVar12 < 4) {
          WritePutsSpace(this,*(char **)(&DAT_001996d0 + uVar12 * 8));
          if ((uint)var[1].loc.filename._M_len < 2) {
            WriteVar(this,var + -1,Space);
          }
        }
        WriteBrVar(this,var,None);
        WritePuts(this,")",Newline);
      }
      ModuleContext::BeginBlock(&this->super_ModuleContext,TryTable,&pTVar11->block);
      WriteFoldedExprList(this,&(pTVar11->block).exprs);
      FlushExprTreeStack(this);
      WriteCloseNewline(this);
      ModuleContext::EndBlock(&this->super_ModuleContext);
    }
    else {
      if (EVar1 == If) {
        pIVar9 = cast<wabt::IfExpr,wabt::Expr>(expr_tree.expr);
        WritePuts(this,"(",None);
        pcVar7 = Opcode::GetName((Opcode *)&Opcode::If_Opcode);
        WriteBeginBlock(this,If,&pIVar9->true_,pcVar7);
        FlushExprTreeVector(this,&expr_tree.children);
        WriteOpenNewline(this,"then");
        WriteFoldedExprList(this,&(pIVar9->true_).exprs);
        FlushExprTreeStack(this);
        WriteCloseNewline(this);
        if ((pIVar9->false_).size_ != 0) {
          WriteOpenNewline(this,"else");
          WriteFoldedExprList(this,&pIVar9->false_);
          FlushExprTreeStack(this);
          WriteCloseNewline(this);
        }
      }
      else {
        if (EVar1 == Loop) {
          WritePuts(this,"(",None);
          pBVar8 = cast<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Expr>(base);
          pcVar7 = Opcode::GetName((Opcode *)&Opcode::Loop_Opcode);
          WriteBeginBlock(this,Loop,&pBVar8->block,pcVar7);
          pBVar8 = cast<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Expr>(base);
        }
        else {
          if (EVar1 == Try) {
            pTVar10 = cast<wabt::TryExpr,wabt::Expr>(expr_tree.expr);
            WritePuts(this,"(",None);
            pcVar7 = Opcode::GetName((Opcode *)&Opcode::Try_Opcode);
            WriteBeginBlock(this,Try,&pTVar10->block,pcVar7);
            WriteOpenNewline(this,"do");
            FlushExprTreeVector(this,&expr_tree.children);
            WriteFoldedExprList(this,&(pTVar10->block).exprs);
            FlushExprTreeStack(this);
            WriteCloseNewline(this);
            if (pTVar10->kind == Delegate) {
              WritePuts(this,"(",None);
              pcVar7 = Opcode::GetName((Opcode *)&Opcode::Delegate_Opcode);
              WritePutsSpace(this,pcVar7);
              WriteVar(this,&pTVar10->delegate_target,None);
              WritePuts(this,")",Newline);
            }
            else if (pTVar10->kind == Catch) {
              pCVar3 = (pTVar10->catches).
                       super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              for (this_00 = (pTVar10->catches).
                             super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
                             super__Vector_impl_data._M_start; this_00 != pCVar3;
                  this_00 = this_00 + 1) {
                WritePuts(this,"(",None);
                bVar5 = Catch::IsCatchAll(this_00);
                if (bVar5) {
                  WritePutsNewline(this,"catch_all");
                }
                else {
                  pcVar7 = Opcode::GetName((Opcode *)&Opcode::Catch_Opcode);
                  WritePutsSpace(this,pcVar7);
                  WriteVar(this,&this_00->var,Newline);
                }
                this->indent_ = this->indent_ + 2;
                WriteFoldedExprList(this,&this_00->exprs);
                FlushExprTreeStack(this);
                WriteCloseNewline(this);
              }
            }
            goto LAB_001427e0;
          }
          if (EVar1 != Block) {
            WritePuts(this,"(",None);
            delegate.super_Delegate._vptr_Delegate = (_func_int **)&PTR__Delegate_00199460;
            delegate.writer_ = this;
            ExprVisitor::ExprVisitor(&local_98,&delegate.super_Delegate);
            ExprVisitor::VisitExpr(&local_98,base);
            ExprVisitor::~ExprVisitor(&local_98);
            this->indent_ = this->indent_ + 2;
            FlushExprTreeVector(this,&expr_tree.children);
            WriteCloseNewline(this);
            goto LAB_001427f0;
          }
          WritePuts(this,"(",None);
          pBVar6 = cast<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Expr>(base);
          pcVar7 = Opcode::GetName((Opcode *)&Opcode::Block_Opcode);
          WriteBeginBlock(this,Block,&pBVar6->block,pcVar7);
          pBVar8 = (BlockExprBase<(wabt::ExprType)27> *)
                   cast<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Expr>(base);
        }
        WriteFoldedExprList(this,&(pBVar8->block).exprs);
        FlushExprTreeStack(this);
      }
LAB_001427e0:
      WriteCloseNewline(this);
      ModuleContext::EndBlock(&this->super_ModuleContext);
    }
LAB_001427f0:
    std::
    vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ::~vector(&expr_tree.children);
    pEVar13 = pEVar13 + 1;
  } while( true );
}

Assistant:

void WatWriter::FlushExprTreeVector(const std::vector<ExprTree>& expr_trees) {
  WABT_TRACE_ARGS(FlushExprTreeVector, "%zu", expr_trees.size());
  for (auto expr_tree : expr_trees) {
    FlushExprTree(expr_tree);
  }
}